

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read.c
# Opt level: O1

archive_read_filter * get_filter(archive *_a,int n)

{
  archive_read_filter *paVar1;
  archive_read_filter *paVar2;
  
  paVar2 = (archive_read_filter *)_a[4].error_string.length;
  paVar1 = paVar2;
  if (paVar2 == (archive_read_filter *)0x0 || n != -1) {
    if (n < 0) {
      return (archive_read_filter *)0x0;
    }
    if (paVar2 != (archive_read_filter *)0x0 && n != 0) {
      do {
        paVar2 = paVar2->upstream;
        if (n < 2) {
          return paVar2;
        }
        n = n + -1;
      } while (paVar2 != (archive_read_filter *)0x0);
    }
  }
  else {
    do {
      paVar2 = paVar1;
      paVar1 = paVar2->upstream;
    } while (paVar2->upstream != (archive_read_filter *)0x0);
  }
  return paVar2;
}

Assistant:

static struct archive_read_filter *
get_filter(struct archive *_a, int n)
{
	struct archive_read *a = (struct archive_read *)_a;
	struct archive_read_filter *f = a->filter;
	/* We use n == -1 for 'the last filter', which is always the
	 * client proxy. */
	if (n == -1 && f != NULL) {
		struct archive_read_filter *last = f;
		f = f->upstream;
		while (f != NULL) {
			last = f;
			f = f->upstream;
		}
		return (last);
	}
	if (n < 0)
		return NULL;
	while (n > 0 && f != NULL) {
		f = f->upstream;
		--n;
	}
	return (f);
}